

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int unres_schema_add_str(lys_module *mod,unres_schema *unres,void *item,UNRES_ITEM type,char *str)

{
  int iVar1;
  lys_node *snode;
  
  snode = (lys_node *)lydict_insert(mod->ctx,str,0);
  iVar1 = unres_schema_add_node(mod,unres,item,type,snode);
  if (iVar1 < 0) {
    lydict_remove(mod->ctx,(char *)snode);
  }
  return iVar1;
}

Assistant:

int
unres_schema_add_str(struct lys_module *mod, struct unres_schema *unres, void *item, enum UNRES_ITEM type,
                     const char *str)
{
    int rc;
    const char *dictstr;

    dictstr = lydict_insert(mod->ctx, str, 0);
    rc = unres_schema_add_node(mod, unres, item, type, (struct lys_node *)dictstr);

    if (rc < 0) {
        lydict_remove(mod->ctx, dictstr);
    }
    return rc;
}